

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

void __thiscall AutoFile::seek(AutoFile *this,int64_t offset,int origin)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)this->m_file == (FILE *)0x0) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"AutoFile::seek: file handle is nullptr");
  }
  else {
    iVar2 = fseek((FILE *)this->m_file,offset,origin);
    if (iVar2 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_00b23206;
    }
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    iVar2 = feof(this,(FILE *)offset);
    pcVar4 = "AutoFile::seek: fseek failed";
    if ((char)iVar2 != '\0') {
      pcVar4 = "AutoFile::seek: end of file";
    }
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)pcVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_00b23206:
  __stack_chk_fail();
}

Assistant:

void AutoFile::seek(int64_t offset, int origin)
{
    if (IsNull()) {
        throw std::ios_base::failure("AutoFile::seek: file handle is nullptr");
    }
    if (std::fseek(m_file, offset, origin) != 0) {
        throw std::ios_base::failure(feof() ? "AutoFile::seek: end of file" : "AutoFile::seek: fseek failed");
    }
}